

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O3

string * extractSubDir(string *__return_storage_ptr__,string *absPath,string *currentMoc)

{
  string *psVar1;
  long *plVar2;
  string *extraout_RAX;
  long *plVar3;
  long *local_80;
  ulong local_78;
  long local_70;
  long lStack_68;
  undefined1 local_60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  long local_30;
  long lStack_28;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  psVar1 = (string *)std::__cxx11::string::find((char)currentMoc,0x2f);
  if (psVar1 != (string *)0xffffffffffffffff) {
    cmsys::SystemTools::GetFilenamePath((string *)local_60,currentMoc);
    plVar2 = (long *)std::__cxx11::string::replace
                               ((ulong)local_60,0,(char *)0x0,(ulong)(absPath->_M_dataplus)._M_p);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_70 = *plVar3;
      lStack_68 = plVar2[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *plVar3;
      local_80 = (long *)*plVar2;
    }
    local_78 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_80,local_78,0,'\x01');
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_30 = *plVar3;
      lStack_28 = plVar2[3];
      local_40._M_allocated_capacity = (size_type)&local_30;
    }
    else {
      local_30 = *plVar3;
      local_40._M_allocated_capacity = (size_type)(long *)*plVar2;
    }
    local_40._8_8_ = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=
              ((string *)__return_storage_ptr__,(string *)local_40._M_local_buf);
    if ((long *)local_40._M_allocated_capacity != &local_30) {
      operator_delete((void *)local_40._M_allocated_capacity,local_30 + 1);
    }
    if (local_80 != &local_70) {
      operator_delete(local_80,local_70 + 1);
    }
    psVar1 = (string *)(local_60 + 0x10);
    if ((string *)local_60._0_8_ != psVar1) {
      operator_delete((void *)local_60._0_8_,local_60._16_8_ + 1);
      psVar1 = extraout_RAX;
    }
  }
  return psVar1;
}

Assistant:

static std::string extractSubDir(const std::string& absPath,
                                 const std::string& currentMoc)
{
  std::string subDir;
  if (currentMoc.find_first_of('/') != std::string::npos)
    {
    subDir = absPath
                  + cmsys::SystemTools::GetFilenamePath(currentMoc) + '/';
    }
  return subDir;
}